

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-async-null-cb.c
# Opt level: O3

int run_test_async_null_cb(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  async_handle.queue.prev._0_4_ = 0xffffffff;
  async_handle.queue.prev._4_4_ = 0xffffffff;
  async_handle.busy = -1;
  async_handle.pending = -1;
  async_handle.async_cb._0_4_ = 0xffffffff;
  async_handle.async_cb._4_4_ = 0xffffffff;
  async_handle.queue.next._0_4_ = 0xffffffff;
  async_handle.queue.next._4_4_ = 0xffffffff;
  async_handle.next_closing._0_4_ = 0xffffffff;
  async_handle.next_closing._4_4_ = 0xffffffff;
  async_handle.flags = 0xffffffff;
  async_handle._60_4_ = 0xffffffff;
  async_handle.handle_queue.prev._0_4_ = 0xffffffff;
  async_handle.handle_queue.next = (uv__queue *)0xffffffffffffffff;
  async_handle.handle_queue.prev._4_4_ = 0xffffffff;
  async_handle.type = ~UV_UNKNOWN_HANDLE;
  async_handle._20_4_ = 0xffffffff;
  async_handle.close_cb._0_4_ = 0xffffffff;
  async_handle.close_cb._4_4_ = 0xffffffff;
  async_handle.data._0_4_ = 0xffffffff;
  async_handle.data._4_4_ = 0xffffffff;
  async_handle.loop._0_4_ = 0xffffffff;
  async_handle.loop._4_4_ = 0xffffffff;
  puVar2 = uv_default_loop();
  iVar1 = uv_async_init(puVar2,&async_handle,(uv_async_cb)0x0);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_check_init(puVar2,&check_handle);
    if (iVar1 != 0) goto LAB_0017e630;
    iVar1 = uv_check_start(&check_handle,check_cb);
    if (iVar1 != 0) goto LAB_0017e63d;
    iVar1 = uv_thread_create(&thread,thread_cb,(void *)0x0);
    if (iVar1 != 0) goto LAB_0017e64a;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0017e657;
    iVar1 = uv_thread_join(&thread);
    if (iVar1 != 0) goto LAB_0017e664;
    if (check_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017e67e;
    }
  }
  else {
    run_test_async_null_cb_cold_1();
LAB_0017e630:
    run_test_async_null_cb_cold_2();
LAB_0017e63d:
    run_test_async_null_cb_cold_3();
LAB_0017e64a:
    run_test_async_null_cb_cold_4();
LAB_0017e657:
    run_test_async_null_cb_cold_5();
LAB_0017e664:
    run_test_async_null_cb_cold_6();
  }
  run_test_async_null_cb_cold_7();
LAB_0017e67e:
  run_test_async_null_cb_cold_8();
  if (check_cb_called == 0) {
    uv_close((uv_handle_t *)&async_handle,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&check_handle,(uv_close_cb)0x0);
    check_cb_called = check_cb_called + 1;
    return extraout_EAX;
  }
  check_cb_cold_1();
  iVar1 = uv_async_send(&async_handle);
  return iVar1;
}

Assistant:

TEST_IMPL(async_null_cb) {
  /*
   * Fill async_handle with garbage values.
   * uv_async_init() should properly initialize struct fields regardless of
   * initial values.
   * This is added to verify paddings between fields do not affect behavior.
   */
  memset(&async_handle, 0xff, sizeof(async_handle));

  ASSERT_OK(uv_async_init(uv_default_loop(), &async_handle, NULL));
  ASSERT_OK(uv_check_init(uv_default_loop(), &check_handle));
  ASSERT_OK(uv_check_start(&check_handle, check_cb));
  ASSERT_OK(uv_thread_create(&thread, thread_cb, NULL));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_OK(uv_thread_join(&thread));
  ASSERT_EQ(1, check_cb_called);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}